

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

Nurse * __thiscall
Hospital::Entered_Nurse
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  __type local_99;
  undefined1 local_70 [64];
  int local_30;
  int local_2c;
  int i;
  int g;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  string *password_local;
  string *username_local;
  Hospital *this_local;
  
  local_2c = 0;
  local_30 = 0;
  _i = All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)password;
  password_local = username;
  username_local = &this->Admin_Username;
  do {
    uVar2 = (ulong)local_30;
    sVar3 = std::vector<Nurse,_std::allocator<Nurse>_>::size(_i);
    if (sVar3 <= uVar2) {
LAB_00123aec:
      pvVar4 = std::vector<Nurse,_std::allocator<Nurse>_>::operator[](_i,(long)local_2c);
      return pvVar4;
    }
    std::vector<Nurse,_std::allocator<Nurse>_>::operator[](_i,(long)local_30);
    Human::User_name_Getter_abi_cxx11_((Human *)(local_70 + 0x20));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_70 + 0x20),username);
    local_99 = false;
    if (_Var1) {
      std::vector<Nurse,_std::allocator<Nurse>_>::operator[](_i,(long)local_30);
      Human::Password_Getter_abi_cxx11_((Human *)local_70);
      local_99 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_70,password);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    if (local_99 != false) {
      local_2c = local_30;
      goto LAB_00123aec;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

Nurse* Hospital :: Entered_Nurse(string username , string password , vector<Nurse> & All_Of_Nurses){
    int g =0;
    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }
    return &All_Of_Nurses[g];
}